

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long local_80;
  double *local_78;
  
  iVar5 = this->kCategoryCount;
  if (0 < (long)iVar5) {
    iVar6 = this->kMatrixSize;
    uVar7 = this->kStateCount;
    pdVar9 = this->grandNumeratorDerivTmp;
    iVar12 = 0;
    local_80 = 0;
    pdVar10 = this->gTransitionMatrices[firstDerivativeIndex];
    uVar8 = this->kPatternCount;
    lVar15 = (long)this->kPartialsPaddedStateCount;
    pdVar11 = this->grandDenominatorDerivTmp;
    local_78 = postOrderPartial;
    do {
      if (0 < (int)uVar8) {
        uVar17 = 0;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = categoryWeights[local_80];
        pdVar18 = local_78;
        do {
          if ((int)uVar7 < 1) {
            auVar21 = ZEXT816(0);
            auVar20 = ZEXT816(0);
          }
          else {
            auVar20 = ZEXT816(0);
            auVar21 = ZEXT816(0);
            uVar13 = 0;
            iVar14 = iVar12;
            do {
              auVar22 = ZEXT864(0) << 0x40;
              uVar16 = 0;
              do {
                auVar23._8_8_ = 0;
                auVar23._0_8_ = pdVar10[(long)iVar14 + uVar16];
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pdVar18[uVar16];
                auVar2 = vfmadd231sd_fma(auVar22._0_16_,auVar23,auVar2);
                auVar22 = ZEXT1664(auVar2);
                uVar16 = uVar16 + 1;
              } while (uVar7 != uVar16);
              lVar1 = uVar13 + (local_80 * (int)uVar8 + uVar17) * lVar15;
              uVar13 = uVar13 + 1;
              iVar14 = iVar14 + uVar7 + 1;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = preOrderPartial[lVar1];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = postOrderPartial[lVar1];
              auVar20 = vfmadd231sd_fma(auVar20,auVar24,auVar3);
              auVar21 = vfmadd231sd_fma(auVar21,auVar24,auVar2);
            } while (uVar13 != uVar7);
          }
          auVar4._8_8_ = 0;
          auVar4._0_8_ = pdVar9[uVar17];
          auVar21 = vfmadd213sd_fma(auVar21,auVar19,auVar4);
          pdVar18 = pdVar18 + lVar15;
          pdVar9[uVar17] = auVar21._0_8_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = pdVar11[uVar17];
          auVar20 = vfmadd213sd_fma(auVar20,auVar19,auVar21);
          pdVar11[uVar17] = auVar20._0_8_;
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar8);
      }
      iVar12 = iVar12 + iVar6;
      local_78 = local_78 + (int)uVar8 * lVar15;
      local_80 = local_80 + 1;
    } while (local_80 != iVar5);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                       const REALTYPE *preOrderPartial,
                                                                       const int firstDerivativeIndex,
                                                                       const int secondDerivativeIndex,
                                                                       const double *categoryRates,
                                                                       const REALTYPE *categoryWeights,
                                                                       const int scalingFactorsIndex,
//                                                                       const REALTYPE *cumulativeScaleBuffer,
                                                                       double *outDerivatives,
                                                                       double *outSumDerivatives,
                                                                       double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {
        const REALTYPE weight = categoryWeights[category];

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            int w = category * kMatrixSize;

            const int patternIndex = category * kPatternCount + pattern;
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE numerator = 0.0;
            REALTYPE denominator = 0.0;

            for (int k = 0; k < kStateCount; k++) {

                REALTYPE sumOverEndState = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sumOverEndState += firstDerivMatrix[w]
                                       * postOrderPartial[v + j]; // fix padded index
                    w++;
                }
                w += T_PAD;

                numerator += sumOverEndState * preOrderPartial[v + k];
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }

            grandNumeratorDerivTmp[pattern] += weight * numerator;
            grandDenominatorDerivTmp[pattern] += weight * denominator;
        }
    }
}